

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<double,_std::allocator<double>_> *
mult_matrix<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *a,vector<double,_std::allocator<double>_> *b)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference this;
  const_reference pvVar4;
  reference pvVar5;
  int local_44;
  int local_40;
  int x;
  int i;
  allocator<double> local_2a;
  undefined1 local_29;
  int local_28;
  int local_24;
  int m;
  int n;
  vector<double,_std::allocator<double>_> *b_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *a_local;
  vector<double,_std::allocator<double>_> *ans;
  
  _m = b;
  b_local = (vector<double,_std::allocator<double>_> *)a;
  a_local = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)__return_storage_ptr__;
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(a);
  local_24 = (int)sVar3;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(b);
  local_28 = (int)sVar3;
  local_29 = 0;
  sVar3 = (size_type)local_24;
  std::allocator<double>::allocator(&local_2a);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,sVar3,&local_2a);
  std::allocator<double>::~allocator(&local_2a);
  for (local_40 = 0; local_40 < local_24; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < local_28; local_44 = local_44 + 1) {
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)b_local,(long)local_40);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this,(long)local_44);
      dVar1 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](b,(long)local_44);
      dVar2 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (__return_storage_ptr__,(long)local_40);
      *pvVar5 = dVar1 * dVar2 + *pvVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> mult_matrix(const std::vector<std::vector<T> >& a, std::vector<T> b){
    int n = a.size();
    int m = b.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
            for (int x = 0; x < m; ++x)
                ans[i] += a[i][x]*b[x];
    return ans;
}